

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O2

sexp_conflict
sexp_mutex_lock(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict mutex,
               sexp_conflict timeout,sexp_conflict thread)

{
  if ((mutex->value).type.getters != (sexp)0x3e) {
    (ctx->value).flonum_bits[0x60a3] = '\x01';
    (ctx->value).opcode.dl = mutex;
    sexp_insert_timed(ctx,ctx,timeout);
    return (sexp_conflict)&DAT_0000003e;
  }
  if (thread != (sexp_conflict)0x13e) {
    ctx = thread;
  }
  (mutex->value).bytecode.length = 0x13e;
  (mutex->value).type.slots = ctx;
  return (sexp_conflict)0x13e;
}

Assistant:

sexp sexp_mutex_lock (sexp ctx, sexp self, sexp_sint_t n, sexp mutex, sexp timeout, sexp thread) {
  if (thread == SEXP_TRUE)
    thread = ctx;
  if (sexp_not(sexp_mutex_lockp(mutex))) {
    sexp_mutex_lockp(mutex) = SEXP_TRUE;
    sexp_mutex_thread(mutex) = thread;
    return SEXP_TRUE;
  } else {
    sexp_context_waitp(ctx) = 1;
    sexp_context_event(ctx) = mutex;
    sexp_insert_timed(ctx, ctx, timeout);
    return SEXP_FALSE;
  }
}